

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtBvhSubtreeInfo>::resize
          (cbtAlignedObjectArray<cbtBvhSubtreeInfo> *this,int newsize,cbtBvhSubtreeInfo *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = this->m_size;
  lVar7 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar6 = lVar7 << 5;
    for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
      uVar3 = *(undefined8 *)(fillData->m_quantizedAabbMax + 1);
      uVar4 = *(undefined8 *)&fillData->m_subtreeSize;
      uVar5 = *(undefined8 *)(fillData->m_padding + 1);
      puVar1 = (undefined8 *)((long)this->m_data->m_quantizedAabbMin + lVar6);
      *puVar1 = *(undefined8 *)fillData;
      puVar1[1] = uVar3;
      puVar1[2] = uVar4;
      puVar1[3] = uVar5;
      lVar6 = lVar6 + 0x20;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}